

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_math_minmax(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  ushort uVar2;
  TRef TVar3;
  TRef TVar4;
  uint uVar5;
  ulong uVar6;
  
  TVar3 = lj_ir_tonumber(J,*J->base);
  uVar1 = rd->data;
  uVar6 = 1;
  do {
    TVar4 = J->base[uVar6];
    if (TVar4 == 0) {
      *J->base = TVar3;
      return;
    }
    TVar4 = lj_ir_tonumber(J,TVar4);
    uVar5 = (TVar4 >> 0x18 & 0x1f) - 0xf;
    if ((TVar3 >> 0x18 & 0x1f) - 0xf < 5) {
      if (4 < uVar5) {
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
        TVar3 = lj_opt_fold(J);
        goto LAB_0014f3b1;
      }
      uVar2 = 0x13;
    }
    else {
      if (uVar5 < 5) {
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
        TVar4 = lj_opt_fold(J);
      }
LAB_0014f3b1:
      uVar2 = 0xe;
    }
    (J->fold).ins.field_0.ot = uVar2 | (ushort)(uVar1 << 8);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    TVar3 = lj_opt_fold(J);
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

static void LJ_FASTCALL recff_math_minmax(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_ir_tonumber(J, J->base[0]);
  uint32_t op = rd->data;
  BCReg i;
  for (i = 1; J->base[i] != 0; i++) {
    TRef tr2 = lj_ir_tonumber(J, J->base[i]);
    IRType t = IRT_INT;
    if (!(tref_isinteger(tr) && tref_isinteger(tr2))) {
      if (tref_isinteger(tr)) tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
      if (tref_isinteger(tr2)) tr2 = emitir(IRTN(IR_CONV), tr2, IRCONV_NUM_INT);
      t = IRT_NUM;
    }
    tr = emitir(IRT(op, t), tr, tr2);
  }
  J->base[0] = tr;
}